

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O2

bool __thiscall features::sort(features *this,uint64_t parse_mask)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  size_t i_1;
  unsigned_long *puVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  size_t i;
  feature temp;
  v_array<feature> slice;
  
  puVar1 = (this->indicies)._begin;
  puVar2 = (this->indicies)._end;
  if (puVar2 != puVar1) {
    if ((this->space_names)._end == (this->space_names)._begin) {
      slice.end_array = (feature *)0x0;
      slice.erase_count = 0;
      slice._begin = (feature *)0x0;
      slice._end = (feature *)0x0;
      puVar3 = puVar1;
      puVar4 = puVar2;
      for (uVar6 = 0; uVar6 < (ulong)((long)puVar4 - (long)puVar3 >> 3); uVar6 = uVar6 + 1) {
        temp.weight_index = puVar3[uVar6] & parse_mask;
        temp.x = (this->values)._begin[uVar6];
        v_array<feature>::push_back(&slice,&temp);
        puVar3 = (this->indicies)._begin;
        puVar4 = (this->indicies)._end;
      }
      qsort(slice._begin,(long)slice._end - (long)slice._begin >> 4,0x10,order_features<feature>);
      lVar5 = 0;
      for (uVar6 = 0; uVar6 < (ulong)((long)slice._end - (long)slice._begin >> 4); uVar6 = uVar6 + 1
          ) {
        (this->values)._begin[uVar6] = *(float *)((long)&(slice._begin)->x + lVar5);
        (this->indicies)._begin[uVar6] =
             *(unsigned_long *)((long)&(slice._begin)->weight_index + lVar5);
        lVar5 = lVar5 + 0x10;
      }
      v_array<feature>::delete_v(&slice);
    }
    else {
      temp.x = 0.0;
      temp._4_4_ = 0;
      temp.weight_index = 0;
      lVar5 = 0;
      puVar3 = puVar1;
      puVar4 = puVar2;
      for (uVar6 = 0; uVar6 < (ulong)((long)puVar4 - (long)puVar3 >> 3); uVar6 = uVar6 + 1) {
        slice._begin = (feature *)CONCAT44(slice._begin._4_4_,(this->values)._begin[uVar6]);
        slice._end = (feature *)(puVar3[uVar6] & parse_mask);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&slice.end_array,
               *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 **)((long)&(((this->space_names)._begin)->
                            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + lVar5));
        v_array<feature_slice>::push_back((v_array<feature_slice> *)&temp,(feature_slice *)&slice);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&slice.end_array);
        puVar3 = (this->indicies)._begin;
        puVar4 = (this->indicies)._end;
        lVar5 = lVar5 + 0x10;
      }
      qsort((void *)temp._0_8_,(long)(temp.weight_index - temp._0_8_) / 0x50,0x50,
            order_features<feature_slice>);
      lVar5 = 0x10;
      lVar7 = 0;
      for (uVar6 = 0; uVar6 < (ulong)((long)(temp.weight_index - temp._0_8_) / 0x50);
          uVar6 = uVar6 + 1) {
        (this->values)._begin[uVar6] = *(float *)(temp._0_8_ + -0x10 + lVar5);
        (this->indicies)._begin[uVar6] = *(unsigned_long *)(temp._0_8_ + -8 + lVar5);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(*(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      **)((long)&(((this->space_names)._begin)->
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar7),(type)(temp._0_8_ + lVar5));
        lVar5 = lVar5 + 0x50;
        lVar7 = lVar7 + 0x10;
      }
      v_array<feature_slice>::delete_v((v_array<feature_slice> *)&temp);
    }
  }
  return puVar2 != puVar1;
}

Assistant:

features_value_iterator(const features_value_iterator& other) : _begin(other._begin) {}